

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O3

void PushQuad(GUI *gui,mu_Rect dst,mu_Rect src,mu_Color color)

{
  float *pfVar1;
  mu_Color *pmVar2;
  int iVar3;
  uint32_t uVar4;
  int iVar5;
  uint32_t uVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  iVar3 = gui->QuadCount;
  if (iVar3 == 0x4000) {
    Render(gui);
    iVar3 = gui->QuadCount;
  }
  gui->QuadCount = iVar3 + 1;
  fVar8 = (float)src.x * 0.0078125;
  fVar9 = (float)src.y * 0.0078125;
  *(ulong *)(gui->UVArray + (iVar3 << 3)) = CONCAT44(fVar9,fVar8);
  gui->UVArray[iVar3 * 8 + 3] = fVar9;
  gui->UVArray[iVar3 * 8 + 4] = fVar8;
  iVar5 = iVar3 * 8 + 2;
  fVar8 = (float)src.w * 0.0078125 + fVar8;
  fVar9 = (float)src.h * 0.0078125 + fVar9;
  gui->UVArray[iVar5] = fVar8;
  *(ulong *)(gui->UVArray + (iVar3 * 8 + 5)) = CONCAT44(fVar8,fVar9);
  gui->UVArray[iVar3 * 8 + 7] = fVar9;
  fVar8 = (float)(dst.w + dst.x);
  fVar9 = (float)dst.y;
  fVar10 = (float)dst.x;
  fVar11 = (float)(dst.h + dst.y);
  *(ulong *)(gui->VertexArray + (iVar3 << 3)) = CONCAT44(fVar9,fVar10);
  pfVar1 = gui->VertexArray + iVar5;
  *pfVar1 = fVar8;
  pfVar1[1] = fVar9;
  pfVar1[2] = fVar10;
  pfVar1[3] = fVar11;
  *(ulong *)(gui->VertexArray + (iVar3 * 8 + 6)) = CONCAT44(fVar11,fVar8);
  pmVar2 = (mu_Color *)(gui->ColorArray + (long)iVar3 * 0x10);
  *pmVar2 = color;
  pmVar2[1] = color;
  pmVar2[2] = color;
  pmVar2[3] = color;
  lVar7 = (long)(iVar3 * 6);
  gui->IndexArray[lVar7] = iVar3 * 4;
  uVar4 = iVar3 * 4 + 1;
  gui->IndexArray[iVar3 * 6 + 1] = uVar4;
  uVar6 = iVar3 * 4 + 2;
  gui->IndexArray[lVar7 + 2] = uVar6;
  gui->IndexArray[lVar7 + 3] = uVar6;
  gui->IndexArray[lVar7 + 4] = iVar3 * 4 + 3;
  gui->IndexArray[lVar7 + 5] = uVar4;
  return;
}

Assistant:

static void PushQuad(GUI* gui, mu_Rect dst, mu_Rect src, mu_Color color) {
    if (gui->QuadCount == BUFFER_SIZE) {
        Render(gui);
    }

    int texvert_idx = gui->QuadCount * 8;
    int color_idx = gui->QuadCount * 16;
    int element_idx = gui->QuadCount * 4;
    int index_idx = gui->QuadCount * 6;
    gui->QuadCount++;

    float x = src.x / (float) ATLAS_WIDTH;
    float y = src.y / (float) ATLAS_HEIGHT;
    float w = src.w / (float) ATLAS_WIDTH;
    float h = src.h / (float) ATLAS_HEIGHT;
    gui->UVArray[texvert_idx + 0] = x;
    gui->UVArray[texvert_idx + 1] = y;
    gui->UVArray[texvert_idx + 2] = x + w;
    gui->UVArray[texvert_idx + 3] = y;
    gui->UVArray[texvert_idx + 4] = x;
    gui->UVArray[texvert_idx + 5] = y + h;
    gui->UVArray[texvert_idx + 6] = x + w;
    gui->UVArray[texvert_idx + 7] = y + h;

    gui->VertexArray[texvert_idx + 0] = dst.x;
    gui->VertexArray[texvert_idx + 1] = dst.y;
    gui->VertexArray[texvert_idx + 2] = dst.x + dst.w;
    gui->VertexArray[texvert_idx + 3] = dst.y;
    gui->VertexArray[texvert_idx + 4] = dst.x;
    gui->VertexArray[texvert_idx + 5] = dst.y + dst.h;
    gui->VertexArray[texvert_idx + 6] = dst.x + dst.w;
    gui->VertexArray[texvert_idx + 7] = dst.y + dst.h;

    memcpy(gui->ColorArray + color_idx +  0, &color, 4);
    memcpy(gui->ColorArray + color_idx +  4, &color, 4);
    memcpy(gui->ColorArray + color_idx +  8, &color, 4);
    memcpy(gui->ColorArray + color_idx + 12, &color, 4);

    gui->IndexArray[index_idx + 0] = element_idx + 0;
    gui->IndexArray[index_idx + 1] = element_idx + 1;
    gui->IndexArray[index_idx + 2] = element_idx + 2;
    gui->IndexArray[index_idx + 3] = element_idx + 2;
    gui->IndexArray[index_idx + 4] = element_idx + 3;
    gui->IndexArray[index_idx + 5] = element_idx + 1;
}